

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form2_SetPixel(SetPixelForm2 SetPixel)

{
  uint8_t value;
  uint32_t uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image image;
  allocator_type local_a9;
  undefined1 local_a8 [40];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  Image local_50;
  
  Unit_Test::intensityArray(&local_68,2);
  value = *local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_a8,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_50,value,0,0,(Image *)local_a8);
  local_a8._0_8_ = &PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_a8);
  uVar3 = rand();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,
             (ulong)(uVar3 % 100 + (uint)(uVar3 % 100 == 0)),(allocator_type *)&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_80,(long)(local_a8._8_8_ - local_a8._0_8_) >> 2,&local_a9);
  if (local_a8._8_8_ != local_a8._0_8_) {
    uVar4 = 0;
    do {
      uVar1 = local_50._width;
      uVar3 = 0;
      if (local_50._width != 0) {
        uVar3 = rand();
        uVar3 = uVar3 % uVar1;
      }
      uVar1 = local_50._height;
      *(uint *)(local_a8._0_8_ + uVar4 * 4) = uVar3;
      if (local_50._height == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = rand();
        uVar3 = uVar3 % uVar1;
      }
      local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = uVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(local_a8._8_8_ - local_a8._0_8_) >> 2));
  }
  (*SetPixel)(&local_50,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,&local_80,
              local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[1]);
  bVar5 = local_a8._8_8_ == local_a8._0_8_;
  if (!bVar5) {
    uVar4 = 0;
    do {
      bVar2 = Unit_Test::verifyImage
                        (&local_50,*(uint32_t *)(local_a8._0_8_ + uVar4 * 4),
                         local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar4],1,1,
                         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start[1]);
      if (!bVar2) break;
      uVar4 = uVar4 + 1;
      bVar2 = uVar4 < (ulong)((long)(local_a8._8_8_ - local_a8._0_8_) >> 2);
      bVar5 = !bVar2;
    } while (bVar2);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if ((_func_int **)local_a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool form2_SetPixel(SetPixelForm2 SetPixel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image  = uniformImage( intensity[0] );
        std::vector< uint32_t > X( randomValue<uint32_t>( 1, 100 ) );
        std::vector< uint32_t > Y( X.size() );

        for (size_t j = 0; j < X.size(); j++) {
            X[j] = randomValue<uint32_t>( 0, image.width() );
            Y[j] = randomValue<uint32_t>( 0, image.height() );
        }

        SetPixel( image, X, Y, intensity[1] );

        for (size_t j = 0; j < X.size(); j++) {
            if( !verifyImage( image, X[j], Y[j], 1, 1, intensity[1] ) )
                return false;
        }

        return true;
    }